

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O3

void __thiscall Args::Arg::process(Arg *this,Context *context)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  logic_error *this_00;
  CmdLine *in_R8;
  QByteArrayView QVar5;
  String local_b8;
  undefined1 local_98 [48];
  String local_68;
  String local_48;
  String local_30;
  
  iVar4 = (*(this->super_ArgIface)._vptr_ArgIface[6])();
  if ((char)iVar4 == '\0') {
    iVar4 = (*(this->super_ArgIface)._vptr_ArgIface[4])(this);
    if ((char)iVar4 != '\0') {
      QVar5.m_data = (storage_type *)0xa;
      QVar5.m_size = (qsizetype)&local_b8;
      QString::fromUtf8(QVar5);
      local_48.m_str.d.d._0_4_ = local_b8.m_str.d.d._0_4_;
      local_48.m_str.d.d._4_4_ = local_b8.m_str.d.d._4_4_;
      local_48.m_str.d.ptr._0_4_ = local_b8.m_str.d.ptr._0_4_;
      local_48.m_str.d.ptr._4_4_ = local_b8.m_str.d.ptr._4_4_;
      local_48.m_str.d.size = local_b8.m_str.d.size;
      (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_b8,this);
      operator+(&local_30,&local_48,&local_b8);
      operator+((String *)local_98,&local_30,"\" requires value that wasn\'t presented.");
      eatOneValue<Args::CmdLine,Args::Context>
                ((String *)(local_98 + 0x18),(Args *)context,(Context *)local_98,
                 (String *)(this->super_ArgIface).m_cmdLine,in_R8);
      (*(this->super_ArgIface)._vptr_ArgIface[0x14])(this,local_98 + 0x18);
      if ((QArrayData *)local_98._24_8_ != (QArrayData *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)local_98._24_8_)->d).d)->_M_i =
             ((__atomic_base<int> *)&(((QString *)local_98._24_8_)->d).d)->_M_i + -1;
        UNLOCK();
        if (((__atomic_base<int> *)&(((QString *)local_98._24_8_)->d).d)->_M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._24_8_,2,8);
        }
      }
      if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,2,8);
        }
      }
      if (&(local_30.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_30.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_30.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_30.m_str.d.d)->super_QArrayData,2,8);
        }
      }
      piVar1 = (int *)CONCAT44(local_b8.m_str.d.d._4_4_,local_b8.m_str.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.m_str.d.d._4_4_,local_b8.m_str.d.d._0_4_),2,8);
        }
      }
      piVar1 = (int *)CONCAT44(local_48.m_str.d.d._4_4_,local_48.m_str.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_48.m_str.d.d._4_4_,local_48.m_str.d.d._0_4_),2,8);
        }
      }
    }
    this->m_isDefined = true;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x28);
  String::String((String *)(local_98 + 0x18),"Argument \"");
  (*(this->super_ArgIface)._vptr_ArgIface[3])(local_98,this);
  operator+(&local_b8,(String *)(local_98 + 0x18),(String *)local_98);
  operator+(&local_68,&local_b8,"\" already defined.");
  std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
  *(undefined ***)this_00 = &PTR__BaseException_00115d18;
  uVar2 = local_68.m_str.d.d._0_4_;
  uVar3 = local_68.m_str.d.d._4_4_;
  local_68.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(this_00 + 0x10) = uVar2;
  *(undefined4 *)(this_00 + 0x14) = uVar3;
  *(undefined4 *)(this_00 + 0x18) = local_68.m_str.d.ptr._0_4_;
  *(undefined4 *)(this_00 + 0x1c) = local_68.m_str.d.ptr._4_4_;
  local_68.m_str.d.ptr = (char16_t *)0x0;
  *(qsizetype *)(this_00 + 0x20) = local_68.m_str.d.size;
  local_68.m_str.d.size = 0;
  __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

inline void
Arg::process( Context & context )
{
	if( !isDefined() )
	{
		if( !isWithValue() )
			setDefined( true );
		else
		{
			setValue( eatOneValue( context,
				String( SL( "Argument \"" ) ) +	name() +
					SL( "\" requires value that wasn't presented." ),
				cmdLine() ) );

			setDefined( true );
		}
	}
	else
		throw BaseException( String( SL( "Argument \"" ) ) +
			name() + SL( "\" already defined." ) );
}